

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  uint uVar1;
  short sVar2;
  int *piVar3;
  long *plVar4;
  int *piVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  long *plVar9;
  long *plVar10;
  uint uVar11;
  ulong *puVar12;
  ushort uVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  ulong *puVar17;
  BYTE *e;
  short *psVar18;
  ulong *puVar19;
  int iVar20;
  ulong uVar21;
  short *psVar22;
  ulong uVar23;
  long *plVar24;
  char *pcVar25;
  long *plVar26;
  ulong uVar27;
  uint uVar28;
  short *psVar29;
  char *pcVar30;
  BYTE *s_2;
  long lVar31;
  int *piVar32;
  BYTE *s;
  int iVar33;
  BYTE *s_1;
  ulong *puVar34;
  long *plVar35;
  bool bVar36;
  short *local_a8;
  short *local_78;
  U16 *hashTable;
  
  iVar14 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
  }
  else {
    state = (void *)0x0;
  }
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar14 = inputSize + (uint)inputSize / 0xff + 0x10;
  }
  iVar33 = (int)dest;
  if (maxOutputSize < iVar14) {
    if (inputSize < 0x1000b) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      if (inputSize == 0) {
        if (maxOutputSize < 1) {
          return 0;
        }
LAB_0010c061:
        *dest = '\0';
        return 1;
      }
      uVar1 = *(uint *)((long)state + 0x4010);
      pcVar30 = dest + maxOutputSize;
      *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
      *(uint *)((long)state + 0x4010) = uVar1 + inputSize;
      *(undefined4 *)((long)state + 0x4014) = 3;
      piVar32 = (int *)source;
      if (0xc < (uint)inputSize) {
        lVar15 = (long)source - (ulong)uVar1;
        *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar1;
        puVar19 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
        piVar5 = (int *)source;
        local_78 = (short *)dest;
LAB_0010b36f:
        uVar21 = 1;
        piVar7 = (int *)((long)piVar5 + 1);
        iVar14 = *(int *)((long)piVar5 + 1);
        uVar11 = acceleration << 6;
        do {
          piVar8 = piVar7;
          piVar7 = (int *)(uVar21 + (long)piVar8);
          piVar32 = piVar5;
          dest = (char *)local_78;
          if (source + ((ulong)(uint)inputSize - 0xb) < piVar7) goto LAB_0010c474;
          uVar21 = (ulong)(uVar11 >> 6);
          uVar11 = uVar11 + 1;
          uVar27 = (ulong)((uint)(iVar14 * -0x61c8864f) >> 0x13);
          uVar23 = (ulong)*(ushort *)((long)state + uVar27 * 2);
          sVar2 = (short)lVar15;
          iVar20 = *piVar7;
          *(short *)((long)state + uVar27 * 2) = (short)piVar8 - sVar2;
          bVar36 = *(int *)(lVar15 + uVar23) != iVar14;
          iVar14 = iVar20;
        } while (bVar36);
        pcVar16 = (char *)(lVar15 + uVar23);
        piVar32 = piVar8;
        if ((source < pcVar16) && (*(char *)((long)piVar8 + -1) == pcVar16[-1])) {
          pcVar25 = source + uVar23 + ~(ulong)uVar1;
          piVar7 = (int *)((long)piVar8 + -1);
          piVar3 = (int *)((long)piVar8 + -1);
          do {
            piVar8 = piVar3;
            piVar32 = piVar7;
            pcVar16 = pcVar25;
            if ((pcVar16 <= source) || (piVar32 <= piVar5)) break;
            pcVar25 = pcVar16 + -1;
            piVar7 = (int *)((long)piVar32 + -1);
            piVar3 = (int *)((long)piVar8 + -1);
          } while (*(char *)((long)piVar32 + -1) == pcVar16[-1]);
        }
        uVar21 = (long)piVar8 - (long)piVar5;
        if (pcVar30 < (char *)((long)local_78 +
                              (uVar21 & 0xffffffff) / 0xff + (uVar21 & 0xffffffff) + 9)) {
          return 0;
        }
        psVar22 = (short *)((long)local_78 + 1);
        if ((uint)uVar21 < 0xf) {
          *(char *)local_78 = (char)uVar21 << 4;
        }
        else {
          uVar11 = (uint)uVar21 - 0xf;
          *(char *)local_78 = -0x10;
          if (0xfe < uVar11) {
            uVar11 = ((int)piVar8 - (int)piVar5) - 0x10e;
            uVar23 = (ulong)uVar11 / 0xff;
            uVar11 = uVar11 % 0xff;
            memset(psVar22,0xff,uVar23 + 1);
            psVar22 = (short *)((long)local_78 + uVar23 + 2);
          }
          *(char *)psVar22 = (char)uVar11;
          psVar22 = (short *)((long)psVar22 + 1);
        }
        psVar18 = (short *)((uVar21 & 0xffffffff) + (long)psVar22);
        do {
          *(undefined8 *)psVar22 = *(undefined8 *)piVar5;
          psVar22 = psVar22 + 4;
          piVar5 = piVar5 + 2;
        } while (psVar22 < psVar18);
        do {
          *psVar18 = (short)piVar32 - (short)pcVar16;
          puVar12 = (ulong *)(piVar32 + 1);
          puVar17 = (ulong *)(pcVar16 + 4);
          puVar34 = puVar12;
          if (puVar12 < puVar19) {
            if (*puVar17 == *puVar12) {
              puVar17 = (ulong *)(pcVar16 + 0xc);
              puVar34 = (ulong *)(piVar32 + 3);
              goto LAB_0010b4e4;
            }
            uVar21 = *puVar12 ^ *puVar17;
            lVar31 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            uVar11 = (uint)lVar31 >> 3;
          }
          else {
LAB_0010b4e4:
            if (puVar34 < puVar19) {
              iVar14 = ((int)puVar34 - (int)piVar32) + -4;
LAB_0010b4f2:
              if (*puVar17 == *puVar34) goto code_r0x0010b4fd;
              uVar23 = *puVar34 ^ *puVar17;
              uVar21 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar11 = ((uint)(uVar21 >> 3) & 0x1fffffff) + iVar14;
              goto LAB_0010b56f;
            }
LAB_0010b50d:
            if ((puVar34 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar17 == (int)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar34 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar17 == (short)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar34 < source + ((ulong)(uint)inputSize - 5)) {
              puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar17 == (char)*puVar34));
            }
            uVar11 = (int)puVar34 - (int)puVar12;
          }
LAB_0010b56f:
          if (pcVar30 < (char *)((long)psVar18 + (ulong)(uVar11 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          dest = (char *)(psVar18 + 1);
          if (uVar11 < 0xf) {
            *(char *)local_78 = (char)*local_78 + (char)uVar11;
          }
          else {
            *(char *)local_78 = (char)*local_78 + '\x0f';
            uVar13 = (ushort)(uVar11 - 0xf);
            *(short *)((long)dest + 0) = -1;
            *(short *)((long)dest + 2) = -1;
            if (0x3fb < uVar11 - 0xf) {
              uVar13 = (ushort)((ulong)(uVar11 - 0x40b) % 0x3fc);
              uVar21 = (ulong)((uVar11 - 0x40b) / 0x3fc << 2);
              memset(psVar18 + 3,0xff,uVar21 + 4);
              dest = (char *)((long)psVar18 + uVar21 + 6);
            }
            pcVar16 = (char *)((long)dest + (ulong)(uVar13 / 0xff));
            dest = pcVar16 + 1;
            *pcVar16 = (char)(uVar13 % 0xff);
          }
          lVar31 = (long)piVar32 + (ulong)uVar11;
          piVar32 = (int *)(lVar31 + 4);
          if (source + ((ulong)(uint)inputSize - 0xb) <= piVar32) break;
          *(short *)((long)state + (ulong)((uint)(*(int *)(lVar31 + 2) * -0x61c8864f) >> 0x13) * 2)
               = ((short)lVar31 + 2) - sVar2;
          iVar14 = *piVar32;
          uVar21 = (ulong)((uint)(iVar14 * -0x61c8864f) >> 0x13);
          uVar23 = (ulong)*(ushort *)((long)state + uVar21 * 2);
          pcVar16 = (char *)(lVar15 + uVar23);
          *(short *)((long)state + uVar21 * 2) = (short)piVar32 - sVar2;
          piVar5 = piVar32;
          local_78 = (short *)dest;
          if (*(int *)(lVar15 + uVar23) != iVar14) goto LAB_0010b36f;
          psVar18 = (short *)((long)dest + 1);
          *dest = '\0';
        } while( true );
      }
LAB_0010c474:
      pcVar16 = source + ((ulong)(uint)inputSize - (long)piVar32);
      if (pcVar30 < (char *)((long)dest + (long)(pcVar16 + (ulong)(pcVar16 + 0xf0) / 0xff + 1))) {
        return 0;
      }
      if (pcVar16 < (char *)0xf) {
        *dest = (char)pcVar16 << 4;
      }
      else {
        pcVar30 = pcVar16 + -0xf;
        *dest = -0x10;
        psVar22 = (short *)((long)dest + 1);
        if ((char *)0xfe < pcVar30) {
          uVar21 = (ulong)(pcVar16 + -0x10e) / 0xff;
          memset(psVar22,0xff,uVar21 + 1);
          pcVar30 = pcVar16 + uVar21 * -0xff + -0x10e;
          psVar22 = (short *)((long)dest + uVar21 + 2);
        }
        *(char *)psVar22 = (char)pcVar30;
        dest = (char *)psVar22;
      }
      memcpy((char *)((long)dest + 1),piVar32,(size_t)pcVar16);
      iVar14 = (int)(char *)((long)dest + 1) + (int)pcVar16;
      goto LAB_0010c54d;
    }
    if ((uint)inputSize < 0x7e000001) {
      uVar1 = *(uint *)((long)state + 0x4010);
      lVar15 = (long)source - (ulong)uVar1;
      plVar9 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
      pcVar30 = dest + maxOutputSize;
      *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
      *(uint *)((long)state + 0x4010) = inputSize + uVar1;
      *(undefined4 *)((long)state + 0x4014) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar1;
      plVar10 = (long *)(source + 2);
      puVar19 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
      plVar35 = (long *)source;
LAB_0010b802:
      lVar31 = *(long *)((long)plVar35 + 1);
      plVar26 = (long *)((long)plVar35 + 1);
      uVar6 = acceleration;
      uVar11 = acceleration * 0x40;
      while( true ) {
        plVar24 = plVar10;
        uVar11 = uVar11 + 1;
        uVar27 = (ulong)uVar6;
        uVar21 = (ulong)(lVar31 * -0x30e4432345000000) >> 0x34;
        uVar6 = *(uint *)((long)state + uVar21 * 4);
        uVar23 = (ulong)uVar6;
        iVar14 = (int)lVar15;
        uVar28 = (int)plVar26 - iVar14;
        lVar31 = *plVar24;
        *(uint *)((long)state + uVar21 * 4) = uVar28;
        if ((uVar28 <= uVar6 + 0xffff) && (*(int *)(lVar15 + uVar23) == (int)*plVar26)) break;
        uVar6 = uVar11 >> 6;
        plVar10 = (long *)(uVar27 + (long)plVar24);
        plVar26 = plVar24;
        if (plVar9 < (long *)(uVar27 + (long)plVar24)) goto LAB_0010bfbf;
      }
      piVar32 = (int *)(uVar23 + lVar15);
      plVar10 = plVar26;
      if ((source < piVar32) && (*(char *)((long)plVar26 - 1) == *(char *)((long)piVar32 - 1))) {
        plVar24 = (long *)((long)plVar26 - 1U);
        piVar5 = (int *)(source + uVar23 + ~(ulong)uVar1);
        plVar4 = (long *)((long)plVar26 - 1U);
        do {
          plVar26 = plVar4;
          piVar32 = piVar5;
          plVar10 = plVar24;
          if ((piVar32 <= source) || (plVar10 <= plVar35)) break;
          plVar24 = (long *)((long)plVar10 + -1);
          piVar5 = (int *)((long)piVar32 + -1);
          plVar4 = (long *)((long)plVar26 - 1);
        } while (*(char *)((long)plVar10 + -1) == *(char *)((long)piVar32 + -1));
      }
      uVar21 = (long)plVar26 - (long)plVar35;
      if (pcVar30 < dest + (uVar21 & 0xffffffff) / 0xff + (uVar21 & 0xffffffff) + 9) {
        return 0;
      }
      plVar24 = (long *)(dest + 1);
      if ((uint)uVar21 < 0xf) {
        *dest = (char)uVar21 << 4;
      }
      else {
        uVar11 = (uint)uVar21 - 0xf;
        *dest = -0x10;
        if (0xfe < uVar11) {
          uVar11 = ((int)plVar26 - (int)plVar35) - 0x10e;
          uVar23 = (ulong)uVar11 / 0xff;
          uVar11 = uVar11 % 0xff;
          memset(plVar24,0xff,uVar23 + 1);
          plVar24 = (long *)(dest + uVar23 + 2);
        }
        *(char *)plVar24 = (char)uVar11;
        plVar24 = (long *)((long)plVar24 + 1);
      }
      plVar26 = (long *)((uVar21 & 0xffffffff) + (long)plVar24);
      do {
        *plVar24 = *plVar35;
        plVar24 = plVar24 + 1;
        plVar35 = plVar35 + 1;
      } while (plVar24 < plVar26);
      do {
        *(short *)plVar26 = (short)plVar10 - (short)piVar32;
        puVar17 = (ulong *)((long)plVar10 + 4);
        puVar12 = (ulong *)(piVar32 + 1);
        puVar34 = puVar17;
        if (puVar17 < puVar19) {
          if (*puVar12 == *puVar17) {
            puVar12 = (ulong *)(piVar32 + 3);
            puVar34 = (ulong *)((long)plVar10 + 0xc);
            goto LAB_0010b97d;
          }
          uVar21 = *puVar17 ^ *puVar12;
          lVar31 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          uVar11 = (uint)lVar31 >> 3;
        }
        else {
LAB_0010b97d:
          if (puVar34 < puVar19) {
            iVar20 = ((int)puVar34 - (int)plVar10) + -4;
LAB_0010b98e:
            if (*puVar12 == *puVar34) goto code_r0x0010b99a;
            uVar23 = *puVar34 ^ *puVar12;
            uVar21 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar11 = ((uint)(uVar21 >> 3) & 0x1fffffff) + iVar20;
            goto LAB_0010ba16;
          }
LAB_0010b9aa:
          if ((puVar34 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar12 == (int)*puVar34))
          {
            puVar34 = (ulong *)((long)puVar34 + 4);
            puVar12 = (ulong *)((long)puVar12 + 4);
          }
          if ((puVar34 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar12 == (short)*puVar34)) {
            puVar34 = (ulong *)((long)puVar34 + 2);
            puVar12 = (ulong *)((long)puVar12 + 2);
          }
          if (puVar34 < source + ((ulong)(uint)inputSize - 5)) {
            puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar12 == (char)*puVar34));
          }
          uVar11 = (int)puVar34 - (int)puVar17;
        }
LAB_0010ba16:
        if (pcVar30 < (char *)((long)plVar26 + (ulong)(uVar11 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        pcVar16 = (char *)((long)plVar26 + 2);
        if (uVar11 < 0xf) {
          *dest = *dest + (char)uVar11;
          dest = pcVar16;
        }
        else {
          *dest = *dest + '\x0f';
          uVar13 = (ushort)(uVar11 - 0xf);
          pcVar16[0] = -1;
          pcVar16[1] = -1;
          pcVar16[2] = -1;
          pcVar16[3] = -1;
          if (0x3fb < uVar11 - 0xf) {
            uVar13 = (ushort)((ulong)(uVar11 - 0x40b) % 0x3fc);
            uVar21 = (ulong)((uVar11 - 0x40b) / 0x3fc << 2);
            memset((char *)((long)plVar26 + 6),0xff,uVar21 + 4);
            pcVar16 = (char *)((long)plVar26 + uVar21 + 6);
          }
          pcVar16[uVar13 / 0xff] = (char)(uVar13 % 0xff);
          dest = pcVar16 + uVar13 / 0xff + 1;
        }
        lVar31 = (long)plVar10 + (ulong)uVar11;
        plVar35 = (long *)(lVar31 + 4);
        if (plVar9 <= plVar35) goto LAB_0010bfbf;
        *(int *)((long)state + ((ulong)(*(long *)(lVar31 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar31 + 2) - iVar14;
        uVar21 = (ulong)(*plVar35 * -0x30e4432345000000) >> 0x34;
        uVar6 = (int)plVar35 - iVar14;
        uVar11 = *(uint *)((long)state + uVar21 * 4);
        *(uint *)((long)state + uVar21 * 4) = uVar6;
        if ((uVar11 + 0xffff < uVar6) ||
           (piVar32 = (int *)((ulong)uVar11 + lVar15), *piVar32 != *(int *)plVar35))
        goto LAB_0010bb3c;
        plVar26 = (long *)(dest + 1);
        *dest = '\0';
        plVar10 = plVar35;
      } while( true );
    }
  }
  else if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize != 0) {
        uVar1 = *(uint *)((long)state + 0x4010);
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
        *(uint *)((long)state + 0x4010) = uVar1 + inputSize;
        *(undefined4 *)((long)state + 0x4014) = 3;
        local_a8 = (short *)dest;
        piVar32 = (int *)source;
        if ((uint)inputSize < 0xd) {
LAB_0010c3e5:
          pcVar30 = source + ((ulong)(uint)inputSize - (long)piVar32);
          if (pcVar30 < (char *)0xf) {
            *(char *)local_a8 = (char)pcVar30 << 4;
          }
          else {
            pcVar16 = pcVar30 + -0xf;
            *(char *)local_a8 = -0x10;
            psVar22 = (short *)((long)local_a8 + 1);
            if ((char *)0xfe < pcVar16) {
              uVar21 = (ulong)(pcVar30 + -0x10e) / 0xff;
              memset((short *)((long)local_a8 + 1),0xff,uVar21 + 1);
              pcVar16 = pcVar30 + uVar21 * -0xff + -0x10e;
              psVar22 = (short *)((long)local_a8 + uVar21 + 2);
            }
            local_a8 = psVar22;
            *(char *)local_a8 = (char)pcVar16;
          }
          memcpy((char *)((long)local_a8 + 1),piVar32,(size_t)pcVar30);
          return ((int)(char *)((long)local_a8 + 1) + (int)pcVar30) - iVar33;
        }
        lVar15 = (long)source - (ulong)uVar1;
        *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar1;
LAB_0010c0db:
        uVar21 = 1;
        piVar5 = (int *)((long)piVar32 + 1);
        iVar14 = *(int *)((long)piVar32 + 1);
        uVar11 = acceleration << 6;
        do {
          piVar7 = piVar5;
          piVar5 = (int *)(uVar21 + (long)piVar7);
          if (source + ((ulong)(uint)inputSize - 0xb) < piVar5) goto LAB_0010c3e5;
          uVar21 = (ulong)(uVar11 >> 6);
          uVar11 = uVar11 + 1;
          uVar27 = (ulong)((uint)(iVar14 * -0x61c8864f) >> 0x13);
          uVar23 = (ulong)*(ushort *)((long)state + uVar27 * 2);
          sVar2 = (short)lVar15;
          iVar20 = *piVar5;
          *(short *)((long)state + uVar27 * 2) = (short)piVar7 - sVar2;
          bVar36 = *(int *)(lVar15 + uVar23) != iVar14;
          iVar14 = iVar20;
        } while (bVar36);
        pcVar30 = (char *)(uVar23 + lVar15);
        piVar5 = piVar7;
        if ((source < pcVar30) && (*(char *)((long)piVar7 + -1) == pcVar30[-1])) {
          pcVar16 = source + uVar23 + ~(ulong)uVar1;
          piVar8 = (int *)((long)piVar7 + -1);
          piVar3 = (int *)((long)piVar7 + -1);
          do {
            piVar7 = piVar3;
            piVar5 = piVar8;
            pcVar30 = pcVar16;
            if ((pcVar30 <= source) || (piVar5 <= piVar32)) break;
            pcVar16 = pcVar30 + -1;
            piVar8 = (int *)((long)piVar5 + -1);
            piVar3 = (int *)((long)piVar7 + -1);
          } while (*(char *)((long)piVar5 + -1) == pcVar30[-1]);
        }
        uVar21 = (long)piVar7 - (long)piVar32;
        psVar22 = (short *)((long)local_a8 + 1);
        if ((uint)uVar21 < 0xf) {
          *(char *)local_a8 = (char)uVar21 << 4;
        }
        else {
          uVar11 = (uint)uVar21 - 0xf;
          *(char *)local_a8 = -0x10;
          if (0xfe < uVar11) {
            uVar11 = ((int)piVar7 - (int)piVar32) - 0x10e;
            uVar23 = (ulong)uVar11 / 0xff;
            uVar11 = uVar11 % 0xff;
            memset(psVar22,0xff,uVar23 + 1);
            psVar22 = (short *)((long)local_a8 + uVar23 + 2);
          }
          *(char *)psVar22 = (char)uVar11;
          psVar22 = (short *)((long)psVar22 + 1);
        }
        psVar18 = (short *)((uVar21 & 0xffffffff) + (long)psVar22);
        do {
          *(undefined8 *)psVar22 = *(undefined8 *)piVar32;
          psVar22 = psVar22 + 4;
          piVar32 = piVar32 + 2;
          psVar29 = local_a8;
        } while (psVar22 < psVar18);
        do {
          *psVar18 = (short)piVar5 - (short)pcVar30;
          local_a8 = psVar18 + 1;
          puVar19 = (ulong *)(piVar5 + 1);
          puVar17 = (ulong *)(pcVar30 + 4);
          puVar12 = puVar19;
          if (puVar19 < source + ((ulong)(uint)inputSize - 0xc)) {
            if (*puVar17 == *puVar19) {
              puVar17 = (ulong *)(pcVar30 + 0xc);
              puVar12 = (ulong *)(piVar5 + 3);
              goto LAB_0010c216;
            }
            uVar23 = *puVar19 ^ *puVar17;
            uVar21 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = uVar21 >> 3 & 0x1fffffff;
            piVar32 = (int *)((long)piVar5 + uVar21 + 4);
LAB_0010c2ca:
            *(char *)psVar29 = (char)*psVar29 + (char)uVar21;
          }
          else {
LAB_0010c216:
            if (puVar12 < source + ((ulong)(uint)inputSize - 0xc)) {
              if (*puVar17 == *puVar12) goto code_r0x0010c22a;
              uVar23 = *puVar12 ^ *puVar17;
              uVar21 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              puVar12 = (ulong *)((long)puVar12 + (uVar21 >> 3 & 0x1fffffff));
            }
            else {
              if ((puVar12 < source + ((ulong)(uint)inputSize - 8)) &&
                 ((int)*puVar17 == (int)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 4);
                puVar17 = (ulong *)((long)puVar17 + 4);
              }
              if ((puVar12 < source + ((ulong)(uint)inputSize - 6)) &&
                 ((short)*puVar17 == (short)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 2);
                puVar17 = (ulong *)((long)puVar17 + 2);
              }
              if (puVar12 < source + ((ulong)(uint)inputSize - 5)) {
                puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar17 == (char)*puVar12));
              }
            }
            uVar21 = (long)puVar12 - (long)puVar19;
            uVar11 = (uint)uVar21;
            piVar32 = (int *)((long)piVar5 + (uVar21 & 0xffffffff) + 4);
            if (uVar11 < 0xf) goto LAB_0010c2ca;
            *(char *)psVar29 = (char)*psVar29 + '\x0f';
            uVar6 = uVar11 - 0xf;
            local_a8[0] = -1;
            local_a8[1] = -1;
            if (0x3fb < uVar6) {
              uVar6 = (uVar11 - 0x40b) % 0x3fc;
              uVar21 = (ulong)((uVar11 - 0x40b) / 0x3fc << 2);
              memset(psVar18 + 3,0xff,uVar21 + 4);
              local_a8 = (short *)((long)psVar18 + uVar21 + 6);
            }
            pcVar30 = (char *)((long)local_a8 + (ulong)(ushort)((uVar6 & 0xffff) / 0xff));
            local_a8 = (short *)(pcVar30 + 1);
            *pcVar30 = (char)((uVar6 & 0xffff) % 0xff);
          }
          if (source + ((ulong)(uint)inputSize - 0xb) <= piVar32) goto LAB_0010c3e5;
          *(short *)((long)state +
                    (ulong)((uint)(*(int *)((long)piVar32 + -2) * -0x61c8864f) >> 0x13) * 2) =
               ((short)piVar32 + -2) - sVar2;
          iVar14 = *piVar32;
          uVar21 = (ulong)((uint)(iVar14 * -0x61c8864f) >> 0x13);
          uVar23 = (ulong)*(ushort *)((long)state + uVar21 * 2);
          pcVar30 = (char *)(uVar23 + lVar15);
          *(short *)((long)state + uVar21 * 2) = (short)piVar32 - sVar2;
          if (*(int *)(lVar15 + uVar23) != iVar14) goto LAB_0010c0db;
          psVar18 = (short *)((long)local_a8 + 1);
          *(char *)local_a8 = '\0';
          psVar29 = local_a8;
          piVar5 = piVar32;
        } while( true );
      }
      goto LAB_0010c061;
    }
  }
  else if ((uint)inputSize < 0x7e000001) {
    uVar1 = *(uint *)((long)state + 0x4010);
    lVar15 = (long)source - (ulong)uVar1;
    plVar9 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
    *(uint *)((long)state + 0x4010) = inputSize + uVar1;
    *(undefined4 *)((long)state + 0x4014) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar1;
    plVar10 = (long *)(source + 2);
    plVar35 = (long *)source;
LAB_0010bc6f:
    lVar31 = *(long *)((long)plVar35 + 1);
    plVar26 = (long *)((long)plVar35 + 1);
    uVar6 = acceleration;
    uVar11 = acceleration * 0x40;
    while( true ) {
      plVar24 = plVar10;
      uVar11 = uVar11 + 1;
      uVar23 = (ulong)uVar6;
      uVar27 = (ulong)(lVar31 * -0x30e4432345000000) >> 0x34;
      uVar6 = *(uint *)((long)state + uVar27 * 4);
      uVar21 = (ulong)uVar6;
      iVar14 = (int)lVar15;
      uVar28 = (int)plVar26 - iVar14;
      lVar31 = *plVar24;
      *(uint *)((long)state + uVar27 * 4) = uVar28;
      if ((uVar28 <= uVar6 + 0xffff) && (*(int *)(lVar15 + uVar21) == (int)*plVar26)) break;
      uVar6 = uVar11 >> 6;
      plVar10 = (long *)(uVar23 + (long)plVar24);
      plVar26 = plVar24;
      if (plVar9 < (long *)(uVar23 + (long)plVar24)) goto LAB_0010c55c;
    }
    piVar32 = (int *)(uVar21 + lVar15);
    plVar10 = plVar26;
    if ((source < piVar32) && (*(char *)((long)plVar26 - 1) == *(char *)((long)piVar32 - 1))) {
      piVar5 = (int *)(source + uVar21 + ~(ulong)uVar1);
      plVar24 = (long *)((long)plVar26 - 1U);
      plVar4 = (long *)((long)plVar26 - 1U);
      do {
        plVar26 = plVar4;
        plVar10 = plVar24;
        piVar32 = piVar5;
        if ((piVar32 <= source) || (plVar10 <= plVar35)) break;
        piVar5 = (int *)((long)piVar32 + -1);
        plVar24 = (long *)((long)plVar10 + -1);
        plVar4 = (long *)((long)plVar26 - 1);
      } while (*(char *)((long)plVar10 + -1) == *(char *)((long)piVar32 + -1));
    }
    uVar21 = (long)plVar26 - (long)plVar35;
    plVar24 = (long *)(dest + 1);
    if ((uint)uVar21 < 0xf) {
      *dest = (char)uVar21 << 4;
    }
    else {
      uVar11 = (uint)uVar21 - 0xf;
      *dest = -0x10;
      if (0xfe < uVar11) {
        uVar11 = ((int)plVar26 - (int)plVar35) - 0x10e;
        uVar23 = (ulong)uVar11 / 0xff;
        uVar11 = uVar11 % 0xff;
        memset(plVar24,0xff,uVar23 + 1);
        plVar24 = (long *)(dest + uVar23 + 2);
      }
      *(char *)plVar24 = (char)uVar11;
      plVar24 = (long *)((long)plVar24 + 1);
    }
    plVar26 = (long *)((uVar21 & 0xffffffff) + (long)plVar24);
    do {
      *plVar24 = *plVar35;
      plVar24 = plVar24 + 1;
      plVar35 = plVar35 + 1;
    } while (plVar24 < plVar26);
    do {
      *(short *)plVar26 = (short)plVar10 - (short)piVar32;
      pcVar30 = (char *)((long)plVar26 + 2);
      puVar17 = (ulong *)((long)plVar10 + 4);
      puVar19 = (ulong *)(piVar32 + 1);
      puVar12 = puVar17;
      if (puVar17 < source + ((ulong)(uint)inputSize - 0xc)) {
        if (*puVar19 == *puVar17) {
          puVar19 = (ulong *)(piVar32 + 3);
          puVar12 = (ulong *)((long)plVar10 + 0xc);
          goto LAB_0010bdc8;
        }
        uVar23 = *puVar17 ^ *puVar19;
        uVar21 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar21 = uVar21 >> 3 & 0x1fffffff;
        plVar35 = (long *)((long)plVar10 + uVar21 + 4);
LAB_0010be93:
        *dest = *dest + (char)uVar21;
        dest = pcVar30;
      }
      else {
LAB_0010bdc8:
        if (puVar12 < source + ((ulong)(uint)inputSize - 0xc)) {
          if (*puVar19 == *puVar12) goto code_r0x0010bddc;
          uVar23 = *puVar12 ^ *puVar19;
          uVar21 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
            }
          }
          puVar12 = (ulong *)((long)puVar12 + (uVar21 >> 3 & 0x1fffffff));
        }
        else {
          if ((puVar12 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar19 == (int)*puVar12))
          {
            puVar12 = (ulong *)((long)puVar12 + 4);
            puVar19 = (ulong *)((long)puVar19 + 4);
          }
          if ((puVar12 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar19 == (short)*puVar12)) {
            puVar12 = (ulong *)((long)puVar12 + 2);
            puVar19 = (ulong *)((long)puVar19 + 2);
          }
          if (puVar12 < source + ((ulong)(uint)inputSize - 5)) {
            puVar12 = (ulong *)((long)puVar12 + (ulong)((char)*puVar19 == (char)*puVar12));
          }
        }
        uVar21 = (long)puVar12 - (long)puVar17;
        uVar11 = (uint)uVar21;
        plVar35 = (long *)((long)plVar10 + (uVar21 & 0xffffffff) + 4);
        if (uVar11 < 0xf) goto LAB_0010be93;
        *dest = *dest + '\x0f';
        uVar6 = uVar11 - 0xf;
        pcVar30[0] = -1;
        pcVar30[1] = -1;
        pcVar30[2] = -1;
        pcVar30[3] = -1;
        if (0x3fb < uVar6) {
          uVar6 = (uVar11 - 0x40b) % 0x3fc;
          uVar21 = (ulong)((uVar11 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)plVar26 + 6),0xff,uVar21 + 4);
          pcVar30 = (char *)((long)plVar26 + uVar21 + 6);
        }
        pcVar30[(ushort)((uVar6 & 0xffff) / 0xff)] = (char)((uVar6 & 0xffff) % 0xff);
        dest = pcVar30 + (ushort)((uVar6 & 0xffff) / 0xff) + 1;
      }
      if (plVar9 <= plVar35) goto LAB_0010c55c;
      *(int *)((long)state +
              ((ulong)(*(long *)((long)plVar35 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)plVar35 + -2) - iVar14;
      uVar21 = (ulong)(*plVar35 * -0x30e4432345000000) >> 0x34;
      uVar6 = (int)plVar35 - iVar14;
      uVar11 = *(uint *)((long)state + uVar21 * 4);
      *(uint *)((long)state + uVar21 * 4) = uVar6;
      if ((uVar11 + 0xffff < uVar6) ||
         (piVar32 = (int *)((ulong)uVar11 + lVar15), *piVar32 != (int)*plVar35)) goto LAB_0010bf4b;
      plVar26 = (long *)(dest + 1);
      *dest = '\0';
      plVar10 = plVar35;
    } while( true );
  }
  return 0;
code_r0x0010bddc:
  puVar19 = puVar19 + 1;
  puVar12 = puVar12 + 1;
  goto LAB_0010bdc8;
LAB_0010bf4b:
  plVar10 = (long *)((long)plVar35 + 2);
  if (plVar9 < plVar10) {
LAB_0010c55c:
    pcVar30 = source + ((ulong)(uint)inputSize - (long)plVar35);
    if (pcVar30 < (char *)0xf) {
      *dest = (char)pcVar30 << 4;
    }
    else {
      pcVar16 = pcVar30 + -0xf;
      *dest = -0x10;
      pcVar25 = dest + 1;
      if ((char *)0xfe < pcVar16) {
        uVar21 = (ulong)(pcVar30 + -0x10e) / 0xff;
        memset(pcVar25,0xff,uVar21 + 1);
        pcVar16 = pcVar30 + uVar21 * -0xff + -0x10e;
        pcVar25 = dest + uVar21 + 2;
      }
      *pcVar25 = (char)pcVar16;
      dest = pcVar25;
    }
    memcpy(dest + 1,plVar35,(size_t)pcVar30);
    return ((int)(dest + 1) + (int)pcVar30) - iVar33;
  }
  goto LAB_0010bc6f;
code_r0x0010c22a:
  puVar17 = puVar17 + 1;
  puVar12 = puVar12 + 1;
  goto LAB_0010c216;
code_r0x0010b4fd:
  puVar34 = puVar34 + 1;
  puVar17 = puVar17 + 1;
  iVar14 = iVar14 + 8;
  if (puVar19 <= puVar34) goto LAB_0010b50d;
  goto LAB_0010b4f2;
code_r0x0010b99a:
  puVar34 = puVar34 + 1;
  puVar12 = puVar12 + 1;
  iVar20 = iVar20 + 8;
  if (puVar19 <= puVar34) goto LAB_0010b9aa;
  goto LAB_0010b98e;
LAB_0010bb3c:
  plVar10 = (long *)(lVar31 + 6);
  if (plVar9 < plVar10) goto LAB_0010bfbf;
  goto LAB_0010b802;
LAB_0010bfbf:
  pcVar16 = source + ((ulong)(uint)inputSize - (long)plVar35);
  if (pcVar30 < dest + (long)(pcVar16 + (ulong)(pcVar16 + 0xf0) / 0xff + 1)) {
    return 0;
  }
  if (pcVar16 < (char *)0xf) {
    *dest = (char)pcVar16 << 4;
  }
  else {
    pcVar30 = pcVar16 + -0xf;
    *dest = -0x10;
    pcVar25 = dest + 1;
    if ((char *)0xfe < pcVar30) {
      uVar21 = (ulong)(pcVar16 + -0x10e) / 0xff;
      memset(pcVar25,0xff,uVar21 + 1);
      pcVar30 = pcVar16 + uVar21 * -0xff + -0x10e;
      pcVar25 = dest + uVar21 + 2;
    }
    *pcVar25 = (char)pcVar30;
    dest = pcVar25;
  }
  memcpy(dest + 1,plVar35,(size_t)pcVar16);
  iVar14 = (int)(dest + 1) + (int)pcVar16;
LAB_0010c54d:
  return iVar14 - iVar33;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}